

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall mario::TimerQueue::TimerQueue(TimerQueue *this,EventLoop *loop)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  int fdArg;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this->_loop = loop;
  fdArg = detail::createTimerfd();
  this->_timerfd = fdArg;
  Channel::Channel(&this->_timerfdChannel,loop,fdArg);
  p_Var2 = &(this->_timers)._M_t._M_impl.super__Rb_tree_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_callingExpiredTimers = false;
  p_Var2 = &(this->_activeTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->_activeTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_cancelingTimers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x18);
  *(code **)local_40._M_unused._0_8_ = handleRead;
  *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
  *(TimerQueue **)((long)local_40._M_unused._0_8_ + 0x10) = this;
  local_28 = std::
             _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*))()>_>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(mario::Timestamp),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*))()>_>
             ::_M_manager;
  std::function<void_(mario::Timestamp)>::operator=
            (&(this->_timerfdChannel)._readCallback,(function<void_(mario::Timestamp)> *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  piVar1 = &(this->_timerfdChannel)._events;
  *piVar1 = *piVar1 | 3;
  Channel::update(&this->_timerfdChannel);
  return;
}

Assistant:

TimerQueue::TimerQueue(EventLoop* loop)
    : _loop(loop)
    , _timerfd(createTimerfd()) 
    , _timerfdChannel(loop, _timerfd)
    , _timers()
    , _callingExpiredTimers(false)
{
    _timerfdChannel.setReadCallback(
            std::bind(&TimerQueue::handleRead, this)
        );
    _timerfdChannel.enableReading();
}